

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_PrecacheClasses(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  TArray<FName,_FName> *this;
  FName local_1c;
  level_info_t *local_18;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  local_18 = info;
  info_local = (level_info_t *)parse;
  FMapInfoParser::ParseAssign(parse);
  do {
    FScanner::MustGetString((FScanner *)info_local);
    this = &local_18->PrecacheClasses;
    FName::FName(&local_1c,*(char **)info_local);
    TArray<FName,_FName>::Push(this,&local_1c);
    bVar1 = FScanner::CheckString((FScanner *)info_local,",");
  } while (bVar1);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheClasses, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		//the class list is not initialized here so all we can do is store the class's name.
		info->PrecacheClasses.Push(parse.sc.String);
	} while (parse.sc.CheckString(","));
}